

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O3

void __thiscall vkt::shaderexecutor::anon_unknown_0::LdexpCase::~LdexpCase(LdexpCase *this)

{
  CommonFunctionCase::~CommonFunctionCase(&this->super_CommonFunctionCase);
  operator_delete(this,0xf0);
  return;
}

Assistant:

LdexpCase (tcu::TestContext& testCtx, glu::DataType baseType, glu::Precision precision, glu::ShaderType shaderType)
		: CommonFunctionCase	(testCtx, getCommonFuncCaseName(baseType, precision, shaderType).c_str(), "ldexp", shaderType)
	{
		const int			vecSize		= glu::getDataTypeScalarSize(baseType);
		const glu::DataType	intType		= vecSize > 1 ? glu::getDataTypeIntVec(vecSize) : glu::TYPE_INT;

		m_spec.inputs.push_back(Symbol("in0", glu::VarType(baseType, precision)));
		m_spec.inputs.push_back(Symbol("in1", glu::VarType(intType, glu::PRECISION_HIGHP)));
		m_spec.outputs.push_back(Symbol("out0", glu::VarType(baseType, glu::PRECISION_HIGHP)));
		m_spec.source = "out0 = ldexp(in0, in1);";
	}